

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  uint uVar2;
  int r_1;
  bool r;
  int n;
  char local_32;
  less<int> local_31;
  undefined1 local_30 [6];
  char c;
  priority_queue<int,_std::less<int>_> pq;
  
  pq._28_4_ = 0;
  CP::priority_queue<int,_std::less<int>_>::priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_30,&local_31);
  __isoc99_scanf("%c",&local_32);
  while (local_32 != 'q') {
    if (((local_32 == 'a') || (local_32 == 'f')) || (local_32 == 'l')) {
      __isoc99_scanf("%d",&r_1);
      if (local_32 == 'a') {
        CP::priority_queue<int,_std::less<int>_>::push
                  ((priority_queue<int,_std::less<int>_> *)local_30,&r_1);
      }
      else if (local_32 == 'f') {
        bVar1 = CP::priority_queue<int,_std::less<int>_>::find
                          ((priority_queue<int,_std::less<int>_> *)local_30,r_1);
        if (bVar1) {
          printf("Found %d\n",(ulong)(uint)r_1);
        }
        else {
          printf("%d not found\n",(ulong)(uint)r_1);
        }
      }
      else if (local_32 == 'l') {
        uVar2 = CP::priority_queue<int,_std::less<int>_>::find_level
                          ((priority_queue<int,_std::less<int>_> *)local_30,r_1);
        if ((int)uVar2 < 0) {
          printf("%d not found\n",(ulong)(uint)r_1);
        }
        else {
          printf("Found %d at level %d\n",(ulong)(uint)r_1,(ulong)uVar2);
        }
      }
    }
    else if (local_32 == 'd') {
      CP::priority_queue<int,_std::less<int>_>::pop
                ((priority_queue<int,_std::less<int>_> *)local_30);
    }
    __isoc99_scanf("%c",&local_32);
  }
  pq._28_4_ = 0;
  CP::priority_queue<int,_std::less<int>_>::~priority_queue
            ((priority_queue<int,_std::less<int>_> *)local_30);
  return pq._28_4_;
}

Assistant:

int main() {
  CP::priority_queue<int> pq;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a' || c == 'f' || c == 'l') {
      // add data
      int n;
      scanf("%d", &n);
      if (c == 'a') {
        pq.push(n);
      } else if (c == 'f') {
        bool r = pq.find(n);
        if (r) {
          printf("Found %d\n",n);
        } else {
          printf("%d not found\n",n);
        }
      } else if (c == 'l') {
        int r = pq.find_level(n);
        if (r >= 0) {
          printf("Found %d at level %d\n",n,r);
        } else {
          printf("%d not found\n",n);
        }
      }
    } else if (c == 'd') {
       pq.pop();
    }
    scanf("%c", &c);
  }
  return 0;
}